

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool.cpp
# Opt level: O0

void Function_Pool::Histogram
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *histogram)

{
  FunctionTask *in_stack_fffffffffffffe80;
  undefined1 *puVar1;
  uint32_t in_stack_fffffffffffffe90;
  uint32_t in_stack_fffffffffffffe94;
  Image *in_stack_fffffffffffffe98;
  FunctionTask *in_stack_fffffffffffffea0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffeb0;
  
  puVar1 = &stack0xfffffffffffffea0;
  FunctionTask::FunctionTask
            ((FunctionTask *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
  FunctionTask::Histogram
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe94,
             in_stack_fffffffffffffe90,(uint32_t)((ulong)puVar1 >> 0x20),(uint32_t)puVar1,
             in_stack_fffffffffffffeb0);
  FunctionTask::~FunctionTask(in_stack_fffffffffffffe80);
  return;
}

Assistant:

void Histogram( const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, std::vector < uint32_t > & histogram )
    {
        FunctionTask().Histogram( image, x, y, width, height, histogram );
    }